

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

int Gia_ManVerifyWithBoxes
              (Gia_Man_t *pGia,int nBTLimit,int nTimeLim,int fSeq,int fDumpFiles,int fVerbose,
              char *pFileSpec)

{
  Tim_Man_t *p;
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  Gia_Man_t *pInit;
  char *pcVar3;
  Gia_Man_t *pGVar4;
  Aig_Man_t *p_01;
  Vec_Int_t *vBoxPres;
  Cec_ParCec_t *p_02;
  Gia_Man_t *pGVar5;
  Gia_Man_t *local_818;
  char pFileName0 [1000];
  char pFileName1 [1000];
  
  if ((pFileSpec == (char *)0x0) && (pGia->pSpec == (char *)0x0)) {
    pcVar3 = "Spec file is not given. Use standard flow.";
    goto LAB_0020eb97;
  }
  iVar1 = Gia_ManBoxNum(pGia);
  if ((iVar1 != 0) && (pGia->pAigExtra == (Gia_Man_t *)0x0)) {
    pcVar3 = "Design has no box logic. Use standard flow.";
    goto LAB_0020eb97;
  }
  pcVar3 = pFileSpec;
  if (pFileSpec == (char *)0x0) {
    pcVar3 = pGia->pSpec;
  }
  p_00 = Gia_AigerRead(pcVar3,0,0,0);
  iVar1 = Gia_ManBoxNum(p_00);
  if ((iVar1 != 0) && (p_00->pAigExtra == (Gia_Man_t *)0x0)) {
    Gia_ManStop(p_00);
    pcVar3 = "Spec has no box logic. Use standard flow.";
    goto LAB_0020eb97;
  }
  p = (Tim_Man_t *)p_00->pManTime;
  if (pGia->pManTime == (void *)0x0) {
    if (p != (Tim_Man_t *)0x0) goto LAB_0020eb1b;
    local_818 = Gia_ManDup(p_00);
    pInit = Gia_ManDup(pGia);
  }
  else {
    if (p == (Tim_Man_t *)0x0) {
LAB_0020eb58:
      vBoxPres = (Vec_Int_t *)0x0;
    }
    else {
LAB_0020eb1b:
      iVar1 = Tim_ManBlackBoxNum(p);
      if ((iVar1 < 1) || (iVar1 = Gia_ManBoxNum(pGia), iVar1 < 1)) goto LAB_0020eb58;
      iVar1 = Gia_ManBoxNum(p_00);
      iVar2 = Gia_ManBoxNum(pGia);
      if (iVar1 < iVar2) {
        pcVar3 = "Spec has less boxes than the design. Cannot proceed.";
LAB_0020eb97:
        puts(pcVar3);
        return -1;
      }
      iVar1 = Gia_ManBoxNum(p_00);
      iVar2 = Gia_ManBoxNum(pGia);
      if (iVar1 <= iVar2) goto LAB_0020eb58;
      vBoxPres = Tim_ManAlignTwo((Tim_Man_t *)p_00->pManTime,(Tim_Man_t *)pGia->pManTime);
      if (vBoxPres == (Vec_Int_t *)0x0) {
        pcVar3 = "Boxes of spec and design cannot be aligned. Cannot proceed.";
        goto LAB_0020eb97;
      }
    }
    iVar1 = Gia_ManBoxNum(p_00);
    if (iVar1 < 1) {
      local_818 = Gia_ManDup(p_00);
    }
    else {
      local_818 = Gia_ManDupCollapse(p_00,p_00->pAigExtra,vBoxPres,fSeq);
    }
    iVar1 = Gia_ManBoxNum(pGia);
    if (iVar1 < 1) {
      pInit = Gia_ManDup(pGia);
    }
    else {
      pInit = Gia_ManDupCollapse(pGia,pGia->pAigExtra,(Vec_Int_t *)0x0,fSeq);
    }
    if (vBoxPres != (Vec_Int_t *)0x0) {
      free(vBoxPres->pArray);
      free(vBoxPres);
    }
  }
  if (fDumpFiles != 0) {
    if (pFileSpec == (char *)0x0) {
      pFileSpec = pGia->pSpec;
    }
    pcVar3 = Extra_FileNameGeneric(pFileSpec);
    sprintf(pFileName0,"%s_spec.aig",pcVar3);
    sprintf(pFileName1,"%s_impl.aig",pcVar3);
    Gia_AigerWrite(local_818,pFileName0,0,0,0);
    Gia_AigerWrite(pInit,pFileName1,0,0,0);
    free(pcVar3);
    printf("Dumped two parts of the miter into files \"%s\" and \"%s\".\n",pFileName0,pFileName1);
  }
  if (fSeq == 0) {
    pGVar4 = Gia_ManMiter(local_818,pInit,0,1,0,0,fVerbose);
    if (pGVar4 != (Gia_Man_t *)0x0) {
      p_02 = (Cec_ParCec_t *)pFileName0;
      Cec_ManCecSetDefaultParams(p_02);
      pGVar5 = pGVar4;
      pFileName0._0_4_ = nBTLimit;
      pFileName0._4_4_ = nTimeLim;
      pFileName0._28_4_ = fVerbose;
      iVar1 = Cec_ManVerify(pGVar4,p_02);
      if (-1 < (int)pFileName0._32_4_) {
        Abc_Print((int)pGVar5,(char *)p_02);
      }
      Gia_ManStop(pGVar4);
      goto LAB_0020ed93;
    }
  }
  else {
    pGVar4 = Gia_ManMiter(local_818,pInit,0,0,1,0,fVerbose);
    if (pGVar4 != (Gia_Man_t *)0x0) {
      Fra_SecSetDefaultParams((Fra_Sec_t *)pFileName0);
      pFileName0[0x2c] = '\0';
      pFileName0[0x2d] = '\0';
      pFileName0[0x2e] = '\0';
      pFileName0[0x2f] = '\0';
      pFileName0._12_4_ = nBTLimit;
      pFileName0._92_4_ = fVerbose;
      pFileName0._100_4_ = nTimeLim;
      p_01 = Gia_ManToAig(pGVar4,0);
      Gia_ManStop(pGVar4);
      iVar1 = Fra_FraigSec(p_01,(Fra_Sec_t *)pFileName0,(Aig_Man_t **)0x0);
      Aig_ManStop(p_01);
      goto LAB_0020ed93;
    }
  }
  iVar1 = -1;
LAB_0020ed93:
  Gia_ManStop(local_818);
  Gia_ManStop(pInit);
  Gia_ManStop(p_00);
  return iVar1;
}

Assistant:

int Gia_ManVerifyWithBoxes( Gia_Man_t * pGia, int nBTLimit, int nTimeLim, int fSeq, int fDumpFiles, int fVerbose, char * pFileSpec )
{
    int Status   = -1;
    Gia_Man_t * pSpec, * pGia0, * pGia1, * pMiter;
    Vec_Int_t * vBoxPres = NULL;
    if ( pFileSpec == NULL && pGia->pSpec == NULL )
    {
        printf( "Spec file is not given. Use standard flow.\n" );
        return Status;
    }
    if ( Gia_ManBoxNum(pGia) && pGia->pAigExtra == NULL )
    {
        printf( "Design has no box logic. Use standard flow.\n" );
        return Status;
    }
    // read original AIG
    pSpec = Gia_AigerRead( pFileSpec ? pFileSpec : pGia->pSpec, 0, 0, 0 );
    if ( Gia_ManBoxNum(pSpec) && pSpec->pAigExtra == NULL )
    {
        Gia_ManStop( pSpec );
        printf( "Spec has no box logic. Use standard flow.\n" );
        return Status;
    }
    // prepare miter
    if ( pGia->pManTime == NULL && pSpec->pManTime == NULL )
    {
        pGia0 = Gia_ManDup( pSpec );
        pGia1 = Gia_ManDup( pGia );
    }
    else
    {
        // if timing managers have different number of black boxes,
        // it is possible that some of the boxes are swept away
        if ( pSpec->pManTime && Tim_ManBlackBoxNum((Tim_Man_t *)pSpec->pManTime) > 0 && Gia_ManBoxNum(pGia) > 0 )
        {
            // specification cannot have fewer boxes than implementation
            if ( Gia_ManBoxNum(pSpec) < Gia_ManBoxNum(pGia) )
            {
                printf( "Spec has less boxes than the design. Cannot proceed.\n" );
                return Status;
            }
            // to align the boxes, find what boxes of pSpec are dropped in pGia
            if ( Gia_ManBoxNum(pSpec) > Gia_ManBoxNum(pGia) )
            {
                vBoxPres = Tim_ManAlignTwo( (Tim_Man_t *)pSpec->pManTime, (Tim_Man_t *)pGia->pManTime );
                if ( vBoxPres == NULL )
                {
                    printf( "Boxes of spec and design cannot be aligned. Cannot proceed.\n" );
                    return Status;
                }
            }
        }
        // collapse two designs
        if ( Gia_ManBoxNum(pSpec) > 0 )
            pGia0 = Gia_ManDupCollapse( pSpec, pSpec->pAigExtra, vBoxPres, fSeq );
        else
            pGia0 = Gia_ManDup( pSpec );
        if ( Gia_ManBoxNum(pGia) > 0 )
            pGia1 = Gia_ManDupCollapse( pGia,  pGia->pAigExtra,  NULL, fSeq  );
        else
            pGia1 = Gia_ManDup( pGia );
        Vec_IntFreeP( &vBoxPres );
    }
    if ( fDumpFiles )
    {
        char pFileName0[1000], pFileName1[1000];
        char * pNameGeneric = Extra_FileNameGeneric( pFileSpec ? pFileSpec : pGia->pSpec );
        sprintf( pFileName0, "%s_spec.aig", pNameGeneric );
        sprintf( pFileName1, "%s_impl.aig", pNameGeneric );
        Gia_AigerWrite( pGia0, pFileName0, 0, 0, 0 );
        Gia_AigerWrite( pGia1, pFileName1, 0, 0, 0 );
        ABC_FREE( pNameGeneric );
        printf( "Dumped two parts of the miter into files \"%s\" and \"%s\".\n", pFileName0, pFileName1 );
    }
    // compute the miter
    if ( fSeq )
    {
        pMiter = Gia_ManMiter( pGia0, pGia1, 0, 0, 1, 0, fVerbose );
        if ( pMiter )
        {
            Aig_Man_t * pMan;
            Fra_Sec_t SecPar, * pSecPar = &SecPar;
            Fra_SecSetDefaultParams( pSecPar );
            pSecPar->fRetimeFirst = 0;
            pSecPar->nBTLimit  = nBTLimit;
            pSecPar->TimeLimit = nTimeLim;
            pSecPar->fVerbose  = fVerbose;
            pMan = Gia_ManToAig( pMiter, 0 );
            Gia_ManStop( pMiter );
            Status = Fra_FraigSec( pMan, pSecPar, NULL );
            Aig_ManStop( pMan );
        }
    }
    else
    {
        pMiter = Gia_ManMiter( pGia0, pGia1, 0, 1, 0, 0, fVerbose );
        if ( pMiter )
        {
            Cec_ParCec_t ParsCec, * pPars = &ParsCec;
            Cec_ManCecSetDefaultParams( pPars );
            pPars->nBTLimit  = nBTLimit;
            pPars->TimeLimit = nTimeLim;
            pPars->fVerbose  = fVerbose;
            Status = Cec_ManVerify( pMiter, pPars );
            if ( pPars->iOutFail >= 0 )
                Abc_Print( 1, "Verification failed for at least one output (%d).\n", pPars->iOutFail );
            Gia_ManStop( pMiter );
        }
    }
    Gia_ManStop( pGia0 );
    Gia_ManStop( pGia1 );
    Gia_ManStop( pSpec );
    return Status;
}